

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_init.c
# Opt level: O0

RK_U32 check_ref_dbp_err(H264_DecCtx_t *p_Dec,H264_RefPicInfo_t *pref,RK_U32 active_refs)

{
  uint index;
  uint uVar1;
  RK_U32 RVar2;
  MppFrame pvStack_30;
  RK_S32 slot_idx;
  MppFrame mframe;
  uint local_20;
  RK_U32 dpb_error_flag;
  RK_U32 i;
  RK_U32 active_refs_local;
  H264_RefPicInfo_t *pref_local;
  H264_DecCtx_t *p_Dec_local;
  
  mframe._4_4_ = 0;
  local_20 = 0;
  dpb_error_flag = active_refs;
  _i = pref;
  pref_local = (H264_RefPicInfo_t *)p_Dec;
  do {
    if (0x1f < local_20) {
      return mframe._4_4_;
    }
    if (_i[local_20].valid != 0) {
      pvStack_30 = (MppFrame)0x0;
      index = *(uint *)(*(long *)&pref_local[1].dpb_idx + (long)_i[local_20].dpb_idx * 0x50 + 4);
      if ((int)index < 0) {
        return mframe._4_4_ | 1;
      }
      mpp_buf_slot_get_prop
                (*(MppBufSlots *)&pref_local[8].bottom_flag,index,SLOT_FRAME_PTR,
                 &stack0xffffffffffffffd0);
      if (pvStack_30 != (MppFrame)0x0) {
        if ((local_20 < dpb_error_flag) &&
           (((*(int *)(*(long *)(pref_local + 6) + 0xd1c) == 0 ||
             ((uint)*(ushort *)
                     (*(long *)&pref_local[1].dpb_idx + (long)_i[local_20].dpb_idx * 0x50 + 0x10) <
              *(uint *)(*(long *)(pref_local + 6) + 0xd28))) ||
            (*(int *)(*(long *)(pref_local + 6) + 0xd2c) <=
             (int)(uint)*(ushort *)
                         (*(long *)&pref_local[1].dpb_idx + (long)_i[local_20].dpb_idx * 0x50 + 0x10
                         ))))) {
          RVar2 = mpp_frame_get_errinfo(pvStack_30);
          mframe._4_4_ = RVar2 | mframe._4_4_;
        }
        uVar1 = local_20;
        if ((h264d_debug & 0x1000) != 0) {
          RVar2 = mpp_frame_get_errinfo(pvStack_30);
          _mpp_log_l(4,"h264d_init","[DPB_REF_ERR] slot_idx=%d, dpb_err[%d]=%d",(char *)0x0,
                     (ulong)index,(ulong)uVar1,RVar2);
        }
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

static RK_U32 check_ref_dbp_err(H264_DecCtx_t *p_Dec, H264_RefPicInfo_t *pref, RK_U32 active_refs)
{
    RK_U32 i = 0;
    RK_U32 dpb_error_flag = 0;

    for (i = 0; i < MAX_REF_SIZE; i++) {
        if (pref[i].valid) {
            MppFrame mframe = NULL;
            RK_S32 slot_idx = p_Dec->dpb_info[pref[i].dpb_idx].slot_index;
            if (slot_idx < 0) {
                dpb_error_flag |= 1;
                break;
            }
            mpp_buf_slot_get_prop(p_Dec->frame_slots, slot_idx, SLOT_FRAME_PTR, &mframe);
            if (mframe) {
                if (i < active_refs
                    && (!p_Dec->p_Vid->recovery.valid_flag
                        || p_Dec->dpb_info[pref[i].dpb_idx].frame_num < p_Dec->p_Vid->recovery.first_frm_valid
                        || p_Dec->dpb_info[pref[i].dpb_idx].frame_num >= p_Dec->p_Vid->recovery.recovery_pic_id)) {
                    dpb_error_flag |= mpp_frame_get_errinfo(mframe);
                }
                H264D_DBG(H264D_DBG_DPB_REF_ERR, "[DPB_REF_ERR] slot_idx=%d, dpb_err[%d]=%d", slot_idx, i, mpp_frame_get_errinfo(mframe));
            }
        }
    }
    return dpb_error_flag;
}